

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

double __thiscall ClipperLib::Int128::AsDouble(Int128 *this)

{
  undefined1 local_38 [8];
  Int128 tmp;
  double bit64;
  double shift64;
  Int128 *this_local;
  
  tmp.lo = 0x43e0000000000000;
  if (this->hi < 0) {
    Int128((Int128 *)local_38,this);
    Negate((Int128 *)local_38);
    if (tmp.hi < 0) {
      this_local = (Int128 *)
                   (-(double)(long)local_38 * 1.8446744073709552e+19 +
                   ((double)tmp.hi - 9.223372036854776e+18));
    }
    else {
      this_local = (Int128 *)(-(double)(long)local_38 * 1.8446744073709552e+19 + -(double)tmp.hi);
    }
  }
  else if (this->lo < 0) {
    this_local = (Int128 *)
                 ((double)this->hi * 1.8446744073709552e+19 +
                 -(double)this->lo + 9.223372036854776e+18);
  }
  else {
    this_local = (Int128 *)((double)this->hi * 1.8446744073709552e+19 + (double)this->lo);
  }
  return (double)this_local;
}

Assistant:

double AsDouble() const
    {
      const double shift64 = 18446744073709551616.0; //2^64
      const double bit64 = 9223372036854775808.0;
      if (hi < 0)
      {
        Int128 tmp(*this);
        Negate(tmp);
        if (tmp.lo < 0)
          return (double)tmp.lo - bit64 - tmp.hi * shift64;
        else
          return -(double)tmp.lo - tmp.hi * shift64;
      }
      else if (lo < 0)
        return -(double)lo + bit64 + hi * shift64;
      else
        return (double)lo + (double)hi * shift64;
    }